

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O3

errr visuals_file_parser_finish(parser *parser)

{
  long lVar1;
  long *plVar2;
  uint8_t uVar3;
  void *p;
  visuals_color_cycle *pvVar4;
  visuals_color_cycle **ppvVar5;
  visuals_color_cycle *p_00;
  char *pcVar6;
  visuals_color_cycle *pvVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  size_t sVar18;
  
  p = parser_priv(parser);
  if (p == (void *)0x0) {
    visuals_cycler_table = (visuals_cycler *)0x0;
    goto LAB_001f2c65;
  }
  sVar11 = 0xffffffffffffffff;
  lVar15 = 8;
  do {
    lVar15 = lVar15 + -8;
    lVar16 = sVar11 * 8;
    sVar11 = sVar11 + 1;
  } while (*(long *)(*(long *)((long)p + 0x30) + 8 + lVar16) != 0);
  if ((sVar11 == 0) ||
     (pvVar4 = (visuals_color_cycle *)mem_zalloc(0x10), pvVar4 == (visuals_color_cycle *)0x0)) {
LAB_001f2bcb:
    pvVar4 = (visuals_color_cycle *)0x0;
  }
  else {
    ppvVar5 = (visuals_color_cycle **)mem_zalloc(-lVar15);
    pvVar4->steps = (uint8_t *)ppvVar5;
    p_00 = pvVar4;
    if (ppvVar5 == (visuals_color_cycle **)0x0) {
LAB_001f2bc3:
      mem_free(p_00);
      goto LAB_001f2bcb;
    }
    pvVar4->max_steps = sVar11;
    lVar15 = 0;
    sVar9 = 0;
    do {
      sVar12 = 0xffffffffffffffff;
      lVar16 = 8;
      do {
        lVar16 = lVar16 + -8;
        lVar1 = sVar12 * 8;
        sVar12 = sVar12 + 1;
      } while (*(long *)(*(long *)((long)p + 0x40) + lVar15 + 8 + lVar1) != 0);
      if (sVar12 == 0) {
LAB_001f2bb6:
        pvVar4 = (visuals_color_cycle *)0x0;
        break;
      }
      pcVar6 = *(char **)(*(long *)((long)p + 0x30) + sVar9 * 8);
      p_00 = (visuals_color_cycle *)mem_zalloc(0x18);
      if (p_00 == (visuals_color_cycle *)0x0) goto LAB_001f2bb6;
      ppvVar5 = (visuals_color_cycle **)mem_zalloc(-lVar16);
      p_00->steps = (uint8_t *)ppvVar5;
      if (ppvVar5 == (visuals_color_cycle **)0x0) goto LAB_001f2bc3;
      p_00->max_steps = sVar12;
      pcVar6 = string_make(pcVar6);
      p_00->cycle_name = pcVar6;
      sVar18 = 0;
      do {
        plVar2 = *(long **)(*(long *)((long)p + 0x40) + sVar9 * 0x200 + sVar18 * 8);
        if (plVar2 == (long *)0x0) {
          pvVar7 = (visuals_color_cycle *)0x0;
        }
        else {
          if (plVar2[1] == 0) {
            uVar3 = (uint8_t)plVar2[3];
            uVar17 = 0;
          }
          else {
            uVar3 = (uint8_t)plVar2[3];
            uVar17 = 0;
            lVar16 = 0;
            do {
              uVar17 = uVar17 + (*(uint8_t *)(*plVar2 + lVar16) != uVar3);
              lVar16 = lVar16 + 1;
            } while (plVar2[1] != lVar16);
          }
          pvVar7 = visuals_color_cycle_new((char *)plVar2[2],uVar17,uVar3);
          if (pvVar7 == (visuals_color_cycle *)0x0) {
            pvVar7 = (visuals_color_cycle *)0x0;
          }
          else if ((uVar17 != 0) && (uVar10 = plVar2[1], uVar10 != 0)) {
            uVar8 = 1;
            uVar13 = 0;
            do {
              uVar3 = *(uint8_t *)(*plVar2 + -1 + uVar8);
              if (uVar3 != (uint8_t)plVar2[3]) {
                pvVar7->steps[uVar13] = uVar3;
                uVar13 = uVar13 + 1;
                uVar10 = plVar2[1];
              }
            } while ((uVar8 < uVar10) && (uVar8 = uVar8 + 1, uVar13 < uVar17));
          }
        }
        *(visuals_color_cycle **)((long)p_00->steps + sVar18 * 8) = pvVar7;
        if (*(visuals_color_cycle **)((long)p_00->steps + sVar18 * 8) == (visuals_color_cycle *)0x0)
        goto LAB_001f2bb6;
        sVar18 = sVar18 + 1;
      } while (sVar12 != sVar18);
      *(visuals_color_cycle **)((long)pvVar4->steps + sVar9 * 8) = p_00;
      sVar9 = sVar9 + 1;
      lVar15 = lVar15 + 0x200;
    } while (sVar11 != sVar9);
  }
  pvVar14 = *(void **)((long)p + 0x10);
  visuals_cycler_table = (visuals_cycler *)pvVar4;
  if (pvVar14 != (void *)0x0) {
    if (*(long *)((long)p + 0x18) != 0) {
      uVar17 = 0;
      do {
        visuals_color_cycle_free(*(visuals_color_cycle **)(*(long *)((long)p + 0x10) + uVar17 * 8));
        uVar17 = uVar17 + 1;
      } while (uVar17 < *(ulong *)((long)p + 0x18));
      pvVar14 = *(void **)((long)p + 0x10);
    }
    mem_free(pvVar14);
    *(undefined8 *)((long)p + 0x10) = 0;
  }
  pvVar14 = *(void **)((long)p + 0x30);
  if (pvVar14 != (void *)0x0) {
    if (*(long *)((long)p + 0x38) != 0) {
      uVar17 = 0;
      do {
        string_free(*(char **)(*(long *)((long)p + 0x30) + uVar17 * 8));
        uVar17 = uVar17 + 1;
      } while (uVar17 < *(ulong *)((long)p + 0x38));
      pvVar14 = *(void **)((long)p + 0x30);
    }
    mem_free(pvVar14);
    *(undefined8 *)((long)p + 0x30) = 0;
  }
  if (*(void **)((long)p + 0x40) != (void *)0x0) {
    mem_free(*(void **)((long)p + 0x40));
    *(undefined8 *)((long)p + 0x40) = 0;
  }
  mem_free(p);
LAB_001f2c65:
  parser_destroy(parser);
  return (uint)(visuals_cycler_table == (visuals_cycler *)0x0) * 5;
}

Assistant:

static errr visuals_file_parser_finish(struct parser *parser)
{
	struct visuals_parse_context *context = parser_priv(parser);
	visuals_cycler_table = visuals_parse_context_convert(context);
	visuals_parse_context_free(context);
	parser_destroy(parser);
	return (visuals_cycler_table == NULL) ? PARSE_ERROR_INTERNAL : PARSE_ERROR_NONE;
}